

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O2

int Load_EXT_framebuffer_object(void)

{
  _func_GLenum_GLenum *p_Var1;
  _func_void_GLsizei_GLuint_ptr *p_Var2;
  _func_void_GLsizei_GLuint_ptr *p_Var3;
  _func_void_GLenum_GLenum_GLenum_GLuint *p_Var4;
  _func_void_GLenum_GLenum_GLenum_GLuint_GLint *p_Var5;
  _func_void_GLenum_GLenum_GLenum_GLuint_GLint *p_Var6;
  _func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *p_Var7;
  _func_void_GLsizei_GLuint_ptr *p_Var8;
  _func_void_GLsizei_GLuint_ptr *p_Var9;
  _func_void_GLenum *p_Var10;
  _func_void_GLenum_GLenum_GLenum_GLint_ptr *p_Var11;
  _func_void_GLenum_GLenum_GLint_ptr *p_Var12;
  _func_GLboolean_GLuint *p_Var13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int local_88;
  int iStack_84;
  int iStack_80;
  int iStack_7c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  sf_ptrc_glBindFramebufferEXT =
       (_func_void_GLenum_GLuint *)sf::Context::getFunction("glBindFramebufferEXT");
  bVar17 = sf_ptrc_glBindFramebufferEXT == (_func_void_GLenum_GLuint *)0x0;
  sf_ptrc_glBindRenderbufferEXT =
       (_func_void_GLenum_GLuint *)sf::Context::getFunction("glBindRenderbufferEXT");
  uVar14 = bVar17 + 1;
  if (sf_ptrc_glBindRenderbufferEXT != (_func_void_GLenum_GLuint *)0x0) {
    uVar14 = (uint)bVar17;
  }
  uVar15 = uVar14;
  p_Var1 = (_func_GLenum_GLenum *)sf::Context::getFunction("glCheckFramebufferStatusEXT");
  sf_ptrc_glCheckFramebufferStatusEXT = p_Var1;
  p_Var2 = (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glDeleteFramebuffersEXT");
  sf_ptrc_glDeleteFramebuffersEXT = p_Var2;
  p_Var3 = (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glDeleteRenderbuffersEXT");
  sf_ptrc_glDeleteRenderbuffersEXT = p_Var3;
  p_Var4 = (_func_void_GLenum_GLenum_GLenum_GLuint *)
           sf::Context::getFunction("glFramebufferRenderbufferEXT");
  sf_ptrc_glFramebufferRenderbufferEXT = p_Var4;
  p_Var5 = (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
           sf::Context::getFunction("glFramebufferTexture1DEXT");
  sf_ptrc_glFramebufferTexture1DEXT = p_Var5;
  p_Var6 = (_func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
           sf::Context::getFunction("glFramebufferTexture2DEXT");
  sf_ptrc_glFramebufferTexture2DEXT = p_Var6;
  p_Var7 = (_func_void_GLenum_GLenum_GLenum_GLuint_GLint_GLint *)
           sf::Context::getFunction("glFramebufferTexture3DEXT");
  sf_ptrc_glFramebufferTexture3DEXT = p_Var7;
  p_Var8 = (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glGenFramebuffersEXT");
  sf_ptrc_glGenFramebuffersEXT = p_Var8;
  p_Var9 = (_func_void_GLsizei_GLuint_ptr *)sf::Context::getFunction("glGenRenderbuffersEXT");
  sf_ptrc_glGenRenderbuffersEXT = p_Var9;
  p_Var10 = (_func_void_GLenum *)sf::Context::getFunction("glGenerateMipmapEXT");
  sf_ptrc_glGenerateMipmapEXT = p_Var10;
  p_Var11 = (_func_void_GLenum_GLenum_GLenum_GLint_ptr *)
            sf::Context::getFunction("glGetFramebufferAttachmentParameterivEXT");
  sf_ptrc_glGetFramebufferAttachmentParameterivEXT = p_Var11;
  p_Var12 = (_func_void_GLenum_GLenum_GLint_ptr *)
            sf::Context::getFunction("glGetRenderbufferParameterivEXT");
  sf_ptrc_glGetRenderbufferParameterivEXT = p_Var12;
  p_Var13 = (_func_GLboolean_GLuint *)sf::Context::getFunction("glIsFramebufferEXT");
  sf_ptrc_glIsFramebufferEXT = p_Var13;
  sf_ptrc_glIsRenderbufferEXT =
       (_func_GLboolean_GLuint *)sf::Context::getFunction("glIsRenderbufferEXT");
  bVar17 = sf_ptrc_glIsRenderbufferEXT == (_func_GLboolean_GLuint *)0x0;
  sf_ptrc_glRenderbufferStorageEXT =
       (_func_void_GLenum_GLenum_GLsizei_GLsizei *)
       sf::Context::getFunction("glRenderbufferStorageEXT");
  local_88 = (int)p_Var9;
  iStack_84 = (int)((ulong)p_Var9 >> 0x20);
  iStack_80 = (int)p_Var10;
  iStack_7c = (int)((ulong)p_Var10 >> 0x20);
  local_78 = (int)p_Var11;
  iStack_74 = (int)((ulong)p_Var11 >> 0x20);
  iStack_70 = (int)p_Var12;
  iStack_6c = (int)((ulong)p_Var12 >> 0x20);
  auVar22._0_4_ = -(uint)(iStack_84 == 0 && local_88 == 0);
  auVar22._4_4_ = -(uint)(iStack_80 == 0 && iStack_7c == 0);
  auVar22._8_4_ = -(uint)(iStack_74 == 0 && local_78 == 0);
  auVar22._12_4_ = -(uint)(iStack_70 == 0 && iStack_6c == 0);
  iVar16 = movmskps(uVar15,auVar22);
  local_98 = (int)p_Var1;
  iStack_94 = (int)((ulong)p_Var1 >> 0x20);
  iStack_90 = (int)p_Var2;
  iStack_8c = (int)((ulong)p_Var2 >> 0x20);
  auVar21._0_4_ = -(uint)(local_98 == 0);
  auVar21._4_4_ = -(uint)(iStack_94 == 0);
  auVar21._8_4_ = -(uint)(iStack_90 == 0);
  auVar21._12_4_ = -(uint)(iStack_8c == 0);
  auVar18._4_4_ = auVar21._0_4_;
  auVar18._0_4_ = auVar21._4_4_;
  auVar18._8_4_ = auVar21._12_4_;
  auVar18._12_4_ = auVar21._8_4_;
  local_68 = (int)p_Var3;
  iStack_64 = (int)((ulong)p_Var3 >> 0x20);
  iStack_60 = (int)p_Var4;
  iStack_5c = (int)((ulong)p_Var4 >> 0x20);
  auVar23._0_4_ = -(uint)(local_68 == 0);
  auVar23._4_4_ = -(uint)(iStack_64 == 0);
  auVar23._8_4_ = -(uint)(iStack_60 == 0);
  auVar23._12_4_ = -(uint)(iStack_5c == 0);
  auVar19._4_4_ = auVar23._0_4_;
  auVar19._0_4_ = auVar23._4_4_;
  auVar19._8_4_ = auVar23._12_4_;
  auVar19._12_4_ = auVar23._8_4_;
  auVar18 = packssdw(auVar18 & auVar21,auVar19 & auVar23);
  local_58 = (int)p_Var5;
  iStack_54 = (int)((ulong)p_Var5 >> 0x20);
  iStack_50 = (int)p_Var6;
  iStack_4c = (int)((ulong)p_Var6 >> 0x20);
  auVar24._0_4_ = -(uint)(local_58 == 0);
  auVar24._4_4_ = -(uint)(iStack_54 == 0);
  auVar24._8_4_ = -(uint)(iStack_50 == 0);
  auVar24._12_4_ = -(uint)(iStack_4c == 0);
  auVar20._4_4_ = auVar24._0_4_;
  auVar20._0_4_ = auVar24._4_4_;
  auVar20._8_4_ = auVar24._12_4_;
  auVar20._12_4_ = auVar24._8_4_;
  local_48 = (int)p_Var7;
  iStack_44 = (int)((ulong)p_Var7 >> 0x20);
  iStack_40 = (int)p_Var8;
  iStack_3c = (int)((ulong)p_Var8 >> 0x20);
  auVar26._0_4_ = -(uint)(local_48 == 0);
  auVar26._4_4_ = -(uint)(iStack_44 == 0);
  auVar26._8_4_ = -(uint)(iStack_40 == 0);
  auVar26._12_4_ = -(uint)(iStack_3c == 0);
  auVar25._4_4_ = auVar26._0_4_;
  auVar25._0_4_ = auVar26._4_4_;
  auVar25._8_4_ = auVar26._12_4_;
  auVar25._12_4_ = auVar26._8_4_;
  auVar21 = packssdw(auVar20 & auVar24,auVar25 & auVar26);
  auVar18 = packssdw(auVar18,auVar21);
  auVar18 = packsswb(auVar18,auVar18);
  return (uint)bVar17 +
         (uint)(sf_ptrc_glRenderbufferStorageEXT == (_func_void_GLenum_GLenum_GLsizei_GLsizei *)0x0)
         + uVar14 +
         ((uint)(0x4332322132212110 >> ((byte)(iVar16 << 2) & 0x3f)) & 7) +
         (((uint)(byte)(SUB161(auVar18 >> 7,0) & 1 | (SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                        (SUB161(auVar18 >> 0x17,0) & 1) << 2 | (SUB161(auVar18 >> 0x1f,0) & 1) << 3
                        | (SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                        (SUB161(auVar18 >> 0x2f,0) & 1) << 5 | (SUB161(auVar18 >> 0x37,0) & 1) << 6
                       | SUB161(auVar18 >> 0x3f,0) << 7) * 0x8040201 >> 3 & 0x11111111) * 0x11111111
         >> 0x1c) + (uint)(p_Var13 == (_func_GLboolean_GLuint *)0x0);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}